

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgProgramExecutor.cpp
# Opt level: O3

void __thiscall rsg::VaryingStore::~VaryingStore(VaryingStore *this)

{
  undefined8 *puVar1;
  void *pvVar2;
  _Rb_tree_node_base *p_Var3;
  _Self __tmp;
  
  for (p_Var3 = (this->m_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->m_values)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    puVar1 = *(undefined8 **)(p_Var3 + 2);
    if ((puVar1 != (undefined8 *)0x0) && (pvVar2 = (void *)*puVar1, pvVar2 != (void *)0x0)) {
      operator_delete(pvVar2,puVar1[2] - (long)pvVar2);
    }
    operator_delete(puVar1,0x18);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rsg::VaryingStorage_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rsg::VaryingStorage_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rsg::VaryingStorage_*>_>_>
  ::clear(&(this->m_values)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rsg::VaryingStorage_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rsg::VaryingStorage_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rsg::VaryingStorage_*>_>_>
  ::~_Rb_tree(&(this->m_values)._M_t);
  return;
}

Assistant:

VaryingStore::~VaryingStore (void)
{
	for (map<string, VaryingStorage*>::iterator i = m_values.begin(); i != m_values.end(); i++)
		delete i->second;
	m_values.clear();
}